

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

string * __thiscall cs::codecvt::gbk::wide2local(gbk *this,u32string *wide)

{
  bool bVar1;
  reference pcVar2;
  undefined8 in_RDX;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *in_RDI;
  char32_t *ch;
  const_iterator __end2;
  const_iterator __begin2;
  u32string *__range2;
  string local;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *__lhs;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_ffffffffffffff98;
  __normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  local_48;
  undefined8 local_40;
  string local_38 [32];
  undefined8 local_18;
  
  __lhs = in_RDI;
  local_18 = in_RDX;
  std::__cxx11::string::string(local_38);
  local_40 = local_18;
  local_48._M_current =
       (char32_t *)
       std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
       begin(in_RDI);
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::end
            (in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                        *)__lhs,(__normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                                 *)in_RDI);
    if (!bVar1) break;
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
             ::operator*(&local_48);
    if ((*pcVar2 & 0x8000U) != 0) {
      std::__cxx11::string::push_back((char)local_38);
    }
    std::__cxx11::string::push_back((char)local_38);
    __gnu_cxx::
    __normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::operator++(&local_48);
  }
  std::__cxx11::string::string((string *)in_RDI,local_38);
  std::__cxx11::string::~string(local_38);
  return (string *)__lhs;
}

Assistant:

std::string wide2local(const std::u32string &wide) override
			{
				std::string local;
				for (auto &ch: wide) {
					if (ch & u32_blck_begin)
						local.push_back(ch >> 8);
					local.push_back(ch);
				}
				return std::move(local);
			}